

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

SplitTuplePromise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_> * __thiscall
kj::_::ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>>::splitImpl<0ul,1ul,2ul>
          (SplitTuplePromise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_>
           *__return_storage_ptr__)

{
  Disposer *local_40;
  PromiseNode *local_38;
  Disposer *local_30;
  PromiseNode *local_28;
  Disposer *local_20;
  PromiseNode *local_18;
  
  addSplit<0ul>((ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>> *)&local_30);
  addSplit<1ul>((ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>> *)&local_40);
  addSplit<2ul>((ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>> *)&local_20);
  (__return_storage_ptr__->impl).super_TupleElement<0U,_kj::Promise<int>_>.value.super_PromiseBase.
  node.disposer = local_30;
  (__return_storage_ptr__->impl).super_TupleElement<0U,_kj::Promise<int>_>.value.super_PromiseBase.
  node.ptr = local_28;
  (__return_storage_ptr__->impl).super_TupleElement<1U,_kj::Promise<kj::String>_>.value.
  super_PromiseBase.node.disposer = local_40;
  (__return_storage_ptr__->impl).super_TupleElement<1U,_kj::Promise<kj::String>_>.value.
  super_PromiseBase.node.ptr = local_38;
  (__return_storage_ptr__->impl).super_TupleElement<2U,_kj::Promise<int>_>.value.super_PromiseBase.
  node.disposer = local_20;
  (__return_storage_ptr__->impl).super_TupleElement<2U,_kj::Promise<int>_>.value.super_PromiseBase.
  node.ptr = local_18;
  return __return_storage_ptr__;
}

Assistant:

_::SplitTuplePromise<T> splitImpl(Indexes<indexes...>) {
    return kj::tuple(addSplit<indexes>()...);
  }